

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  Tag *pTVar7;
  bool bVar8;
  long lVar9;
  
  iVar1 = this->m_tags_size;
  bVar8 = true;
  if (iVar1 <= this->m_tags_count) {
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    lVar5 = (long)iVar6 * 0x10;
    uVar3 = 0xffffffffffffffff;
    if (-1 < iVar6) {
      uVar3 = lVar5 + 8;
    }
    plVar2 = (long *)operator_new__(uVar3,(nothrow_t *)&std::nothrow);
    if (plVar2 == (long *)0x0) {
      bVar8 = false;
    }
    else {
      *plVar2 = (long)iVar6;
      lVar9 = 0;
      pTVar7 = (Tag *)(plVar2 + 1);
      do {
        Tag::Tag(pTVar7);
        lVar9 = lVar9 + -0x10;
        pTVar7 = pTVar7 + 1;
      } while (-lVar9 != lVar5);
      pTVar7 = this->m_tags;
      uVar4 = 0;
      uVar3 = (ulong)(uint)this->m_tags_count;
      if (this->m_tags_count < 1) {
        uVar3 = uVar4;
      }
      bVar8 = true;
      for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
        *(undefined8 *)((long)plVar2 + uVar4 + 8) =
             *(undefined8 *)((long)&pTVar7->m_simple_tags + uVar4);
        *(undefined8 *)((long)plVar2 + uVar4 + 0x10) =
             *(undefined8 *)((long)&pTVar7->m_simple_tags_size + uVar4);
      }
      if (pTVar7 != (Tag *)0x0) {
        lVar5._0_4_ = pTVar7[-1].m_simple_tags_size;
        lVar5._4_4_ = pTVar7[-1].m_simple_tags_count;
        if (lVar5 != 0) {
          lVar5 = lVar5 << 4;
          do {
            Tag::~Tag((Tag *)((long)&pTVar7[-1].m_simple_tags + lVar5));
            lVar5 = lVar5 + -0x10;
          } while (lVar5 != 0);
        }
        operator_delete__(&pTVar7[-1].m_simple_tags_size);
      }
      this->m_tags = (Tag *)(plVar2 + 1);
      this->m_tags_size = iVar6;
    }
  }
  return bVar8;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (m_tags_size > m_tags_count)
    return true;  // nothing else to do

  const int size = (m_tags_size == 0) ? 1 : 2 * m_tags_size;

  Tag* const tags = new (std::nothrow) Tag[size];

  if (tags == NULL)
    return false;

  for (int idx = 0; idx < m_tags_count; ++idx) {
    m_tags[idx].ShallowCopy(tags[idx]);
  }

  delete[] m_tags;
  m_tags = tags;

  m_tags_size = size;
  return true;
}